

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::loadDesc(SPxBasisBase<double> *this,Desc *ds)

{
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar1;
  double dVar2;
  SPxOut *pSVar3;
  Status *pSVar4;
  SPxId *pSVar5;
  char cVar6;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *this_00;
  Status SVar7;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar8;
  SVectorBase<double> *pSVar9;
  SPxSolverBase<double> *pSVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  double dVar13;
  Verbosity old_verbosity;
  DataKey local_70;
  undefined4 local_64;
  DataKey local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
    local_70.info = pSVar3->m_verbosity;
    local_60.info = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],
               "IBASIS02 loading of Basis invalidates factorization",0x33);
    cVar6 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_70);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  pDVar8 = (DataArray<soplex::SPxBasisBase<double>::Desc::Status> *)0x0;
  this->iterCount = 0;
  this->updateCount = 0;
  this_00 = &(this->thedesc).rowstat;
  if ((Desc *)this_00 == ds) {
    pSVar10 = this->theLP;
  }
  else {
    Desc::operator=((Desc *)this_00,ds);
    reDim(this);
    this->minStab = 0.0;
    pSVar10 = this->theLP;
    pDVar1 = &(this->thedesc).colstat;
    pDVar8 = pDVar1;
    if (pSVar10->theRep != ROW) {
      pDVar8 = this_00;
      this_00 = pDVar1;
    }
    (this->thedesc).stat = this_00;
    (this->thedesc).costat = pDVar8;
  }
  this->nzCount = 0;
  local_64 = (undefined4)CONCAT71((int7)((ulong)pDVar8 >> 8),1);
  if ((pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
      thenum < 1) {
    iVar11 = 0;
  }
  else {
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    lVar12 = 0;
    iVar11 = 0;
    do {
      pSVar4 = (this->thedesc).rowstat.data;
      if (pSVar4[lVar12] < ~P_FREE) {
        dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar12];
        dVar13 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar12];
        if ((dVar2 != dVar13) || (NAN(dVar2) || NAN(dVar13))) {
          ::soplex::infinity::__tls_init();
          dVar13 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12];
          if (local_58 < dVar2) {
            ::soplex::infinity::__tls_init();
            pSVar4 = (this->thedesc).rowstat.data;
            if ((local_48 <= dVar13) || (SVar7 = pSVar4[lVar12], SVar7 == P_ON_LOWER)) {
LAB_001c5599:
              pSVar4[lVar12] = P_ON_LOWER;
              SVar7 = P_ON_LOWER;
              goto LAB_001c5428;
            }
            if (SVar7 == P_ON_UPPER) {
              pSVar10 = this->theLP;
            }
            else {
              pSVar10 = this->theLP;
              if ((pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12] <= 0.0) goto LAB_001c5599;
            }
            dVar13 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12];
          }
          ::soplex::infinity::__tls_init();
          pSVar4 = (this->thedesc).rowstat.data;
          if (local_48 <= dVar13) {
            pSVar4[lVar12] = P_FREE;
            SVar7 = P_FREE;
          }
          else {
            pSVar4[lVar12] = P_ON_UPPER;
            SVar7 = P_ON_UPPER;
          }
        }
        else {
          pSVar4[lVar12] = P_FIXED;
          SVar7 = P_FIXED;
        }
      }
      else {
        SVar7 = dualRowStatus(this,(int)lVar12);
        (this->thedesc).rowstat.data[lVar12] = SVar7;
      }
LAB_001c5428:
      pSVar10 = this->theLP;
      if (0 < SVar7 * pSVar10->theRep) {
        if (iVar11 == (this->matrix).thesize) {
          local_64 = 0;
          break;
        }
        local_60 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar12];
        SPxRowId::SPxRowId((SPxRowId *)&local_70,&local_60);
        pSVar5 = (this->theBaseId).data;
        pSVar5[iVar11].super_DataKey = local_70;
        pSVar5[iVar11].super_DataKey.info = -1;
        pSVar9 = SPxSolverBase<double>::vector(this->theLP,(SPxRowId *)&local_70);
        (this->matrix).data[iVar11] = pSVar9;
        this->nzCount = this->nzCount + (this->matrix).data[iVar11]->memused;
        pSVar10 = this->theLP;
        iVar11 = iVar11 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  if (0 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    lVar12 = 0;
    do {
      pSVar4 = (this->thedesc).colstat.data;
      if (pSVar4[lVar12] < ~P_FREE) {
        dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar12];
        dVar13 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar12];
        if ((dVar2 != dVar13) || (NAN(dVar2) || NAN(dVar13))) {
          ::soplex::infinity::__tls_init();
          dVar13 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12];
          if (local_58 < dVar2) {
            ::soplex::infinity::__tls_init();
            pSVar4 = (this->thedesc).colstat.data;
            if ((local_48 <= dVar13) || (SVar7 = pSVar4[lVar12], SVar7 == P_ON_LOWER)) {
LAB_001c57dc:
              pSVar4[lVar12] = P_ON_LOWER;
              SVar7 = P_ON_LOWER;
              goto LAB_001c5665;
            }
            if (SVar7 == P_ON_UPPER) {
              pSVar10 = this->theLP;
            }
            else {
              pSVar10 = this->theLP;
              if ((pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12] <= 0.0) goto LAB_001c57dc;
            }
            dVar13 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12];
          }
          ::soplex::infinity::__tls_init();
          pSVar4 = (this->thedesc).colstat.data;
          if (local_48 <= dVar13) {
            pSVar4[lVar12] = P_FREE;
            SVar7 = P_FREE;
          }
          else {
            pSVar4[lVar12] = P_ON_UPPER;
            SVar7 = P_ON_UPPER;
          }
        }
        else {
          pSVar4[lVar12] = P_FIXED;
          SVar7 = P_FIXED;
        }
      }
      else {
        SVar7 = dualColStatus(this,(int)lVar12);
        (this->thedesc).colstat.data[lVar12] = SVar7;
      }
LAB_001c5665:
      pSVar10 = this->theLP;
      if (0 < SVar7 * pSVar10->theRep) {
        if (iVar11 == (this->matrix).thesize) goto LAB_001c5813;
        local_60 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar12];
        SPxColId::SPxColId((SPxColId *)&local_70,&local_60);
        pSVar5 = (this->theBaseId).data;
        pSVar5[iVar11].super_DataKey = local_70;
        pSVar5[iVar11].super_DataKey.info = 1;
        pSVar9 = SPxSolverBase<double>::vector(this->theLP,(SPxColId *)&local_70);
        (this->matrix).data[iVar11] = pSVar9;
        this->nzCount = this->nzCount + (this->matrix).data[iVar11]->memused;
        pSVar10 = this->theLP;
        iVar11 = iVar11 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  if (((byte)local_64 & (this->matrix).thesize <= iVar11) == 0) {
LAB_001c5813:
    restoreInitialBasis(this);
  }
  else {
    this->matrixIsSetup = true;
  }
  this->factorized = false;
  if (this->factor != (SLinSolver<double> *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}